

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

ssize_t __thiscall
icu_63::number::impl::NumberStringBuilder::splice
          (NumberStringBuilder *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,
          size_t __len,uint __flags)

{
  UBool UVar1;
  char16_t cVar2;
  int iVar3;
  uint count_00;
  char16_t *pcVar4;
  Field *pFVar5;
  undefined4 in_register_0000000c;
  UErrorCode *in_stack_00000010;
  int local_44;
  int local_40;
  int32_t i;
  int32_t position;
  int32_t count;
  int32_t otherLength;
  int32_t thisLength;
  int32_t endOther_local;
  int32_t startOther_local;
  UnicodeString *unistr_local;
  int32_t endThis_local;
  int32_t startThis_local;
  NumberStringBuilder *this_local;
  
  iVar3 = (int)__len - (int)__offout;
  count_00 = iVar3 - ((int)__offin - __fdin);
  if ((int)count_00 < 1) {
    local_40 = remove(this,(char *)(ulong)(uint)__fdin);
  }
  else {
    local_40 = prepareForInsert(this,__fdin,count_00,in_stack_00000010);
  }
  UVar1 = ::U_FAILURE(*in_stack_00000010);
  if (UVar1 == '\0') {
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      cVar2 = UnicodeString::charAt
                        ((UnicodeString *)CONCAT44(in_register_0000000c,__fdout),
                         (int)__offout + local_44);
      pcVar4 = getCharPtr(this);
      pcVar4[local_40 + local_44] = cVar2;
      pFVar5 = getFieldPtr(this);
      pFVar5[local_40 + local_44] = __flags;
    }
  }
  return (ulong)count_00;
}

Assistant:

int32_t
NumberStringBuilder::splice(int32_t startThis, int32_t endThis,  const UnicodeString &unistr,
                            int32_t startOther, int32_t endOther, Field field, UErrorCode& status) {
    int32_t thisLength = endThis - startThis;
    int32_t otherLength = endOther - startOther;
    int32_t count = otherLength - thisLength;
    int32_t position;
    if (count > 0) {
        // Overall, chars need to be added.
        position = prepareForInsert(startThis, count, status);
    } else {
        // Overall, chars need to be removed or kept the same.
        position = remove(startThis, -count);
    }
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < otherLength; i++) {
        getCharPtr()[position + i] = unistr.charAt(startOther + i);
        getFieldPtr()[position + i] = field;
    }
    return count;
}